

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::AssignOp::tokenize(AssignOp *this,GeneratorState *state,TokenStream *str)

{
  TokenStream *this_00;
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  AssignOp *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  (*this->m_lvalueExpr->_vptr_Expression[3])(this->m_lvalueExpr,state,str);
  this_00 = local_20;
  Token::Token(&local_30,EQUAL);
  TokenStream::operator<<(this_00,&local_30);
  Token::~Token(&local_30);
  (*this->m_rvalueExpr->_vptr_Expression[3])(this->m_rvalueExpr,str_local,local_20);
  return;
}

Assistant:

void AssignOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_lvalueExpr->tokenize(state, str);
	str << Token::EQUAL;
	m_rvalueExpr->tokenize(state, str);
}